

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int status;
  int iVar2;
  Memcontrol *ud;
  lua_State *L;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  
  ud = luaB_getmemcontrol();
  L = lua_newstate(debug_realloc,ud);
  if (L == (lua_State *)0x0) {
    l_message((lua_State *)0x0,*argv,"cannot create state: not enough memory");
    uVar5 = 1;
  }
  else {
    pcVar3 = getenv("RAVI_DEBUG_EXPR");
    pcVar4 = getenv("RAVI_DEBUG_CODEGEN");
    uVar5 = (pcVar3 != (char *)0x0) + 2;
    if (pcVar4 == (char *)0x0) {
      uVar5 = (uint)(pcVar3 != (char *)0x0);
    }
    pcVar3 = getenv("RAVI_DEBUG_VARS");
    uVar1 = uVar5 + 4;
    if (pcVar3 == (char *)0x0) {
      uVar1 = uVar5;
    }
    pcVar3 = getenv("RAVI_DEBUG_STACK");
    uVar5 = uVar1 + 8;
    if (pcVar3 == (char *)0x0) {
      uVar5 = uVar1;
    }
    ravi_set_debuglevel(uVar5);
    lua_pushcclosure(L,pmain,0);
    lua_pushinteger(L,(long)argc);
    lua_pushlightuserdata(L,argv);
    status = lua_pcallk(L,2,1,0,0,(lua_KFunction)0x0);
    iVar2 = lua_toboolean(L,-1);
    report(L,status);
    lua_close(L);
    uVar5 = (uint)(status != 0 || iVar2 == 0);
  }
  return uVar5;
}

Assistant:

int main (int argc, char **argv) {
  int status, result;
  lua_State *L = luaL_newstate();  /* create state */
  if (L == NULL) {
    l_message(L, argv[0], "cannot create state: not enough memory");
    return EXIT_FAILURE;
  }
  int level = 0;
  if (getenv("RAVI_DEBUG_EXPR"))
    level |= 1;
  if (getenv("RAVI_DEBUG_CODEGEN"))
    level |= 2;
  if (getenv("RAVI_DEBUG_VARS"))
    level |= 4;
  if (getenv("RAVI_DEBUG_STACK"))
    level |= 8;
  ravi_set_debuglevel(level);

  lua_pushcfunction(L, &pmain);  /* to call 'pmain' in protected mode */
  lua_pushinteger(L, argc);  /* 1st argument */
  lua_pushlightuserdata(L, argv); /* 2nd argument */
  status = lua_pcall(L, 2, 1, 0);  /* do the call */
  result = lua_toboolean(L, -1);  /* get result */
  report(L, status);
  lua_close(L);
  return (result && status == LUA_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
}